

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

Quaternion * AML::quatKinematicRates_BodyRates(Quaternion *quat,Vector3 *bodyRates)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Quaternion *in_RDI;
  double dVar8;
  
  dVar2 = (bodyRates->field_0).data[0];
  dVar3 = (bodyRates->field_0).data[1];
  dVar4 = (quat->field_0).data[0];
  dVar5 = (quat->field_0).data[1];
  dVar6 = (quat->field_0).data[2];
  dVar7 = (quat->field_0).data[3];
  dVar1 = (bodyRates->field_0).data[2];
  dVar8 = -dVar5;
  (in_RDI->field_0).data[0] = ((dVar8 * dVar2 + -dVar6 * dVar3) - dVar7 * dVar1) * 0.5;
  (in_RDI->field_0).data[1] = ((dVar4 * dVar2 + dVar7 * dVar3) - dVar6 * dVar1) * 0.5;
  (in_RDI->field_0).data[2] = (dVar5 * dVar1 + -dVar7 * dVar2 + dVar4 * dVar3) * 0.5;
  (in_RDI->field_0).data[3] = (dVar4 * dVar1 + dVar6 * dVar2 + dVar8 * dVar3) * 0.5;
  return in_RDI;
}

Assistant:

Quaternion quatKinematicRates_BodyRates(const Quaternion& quat, const Vector3& bodyRates)
    {
        const double p = bodyRates.x;
        const double q = bodyRates.y;
        const double r = bodyRates.z;
        const double q0 = 0.5 * (-quat.q1 * p - quat.q2 * q - quat.q3 * r);
        const double q1 = 0.5 * (quat.q0 * p + quat.q3 * q - quat.q2 * r);
        const double q2 = 0.5 * (-quat.q3 * p + quat.q0 * q + quat.q1 * r);
        const double q3 = 0.5 * (quat.q2 * p - quat.q1 * q + quat.q0 * r);
        return Quaternion(q0, q1, q2, q3);
    }